

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::FormatArgImpl::
Dispatch<std::basic_string_view<char,std::char_traits<char>>>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  FormatConversionSpecImpl conv;
  string_view v;
  FormatConversionChar FVar1;
  bool bVar2;
  StringConvertResult SVar3;
  FormatConversionCharSet set;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  FormatSinkImpl *sink;
  void *out_local;
  Data local_24;
  FormatConversionSpecImpl spec_local;
  Data arg_local;
  
  sink = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),spec.precision_);
  spec_local._0_4_ = spec._0_4_;
  local_24 = arg;
  spec_local._4_8_ = this;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_24);
  if (FVar1 == 0x13) {
    arg_local.buf[7] =
         ToInt<std::basic_string_view<char,std::char_traits<char>>>(spec_local._4_8_,sink);
  }
  else {
    set = ArgumentToConv<std::basic_string_view<char,std::char_traits<char>>>();
    FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_24);
    bVar2 = Contains(set,FVar1);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      pbVar4 = Manager<std::basic_string_view<char,_std::char_traits<char>_>,_(absl::lts_20250127::str_format_internal::FormatArgImpl::StoragePolicy)0>
               ::Value((Data)spec_local._4_8_);
      v._M_len = pbVar4->_M_len;
      v._M_str = pbVar4->_M_str;
      conv.precision_._0_1_ = spec_local.conv_;
      conv.precision_._1_1_ = spec_local.flags_;
      conv.precision_._2_1_ = spec_local.length_mod_;
      conv.precision_._3_1_ = spec_local._3_1_;
      conv._0_8_ = local_24.ptr;
      SVar3 = str_format_internal::FormatConvertImpl(v,conv,sink);
      arg_local.buf[7] = SVar3.value & 1;
    }
    else {
      arg_local.buf[7] = '\0';
    }
  }
  return (bool)arg_local.buf[7];
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }